

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O3

word wwShHiCarry(word *a,size_t n,size_t shift,word carry)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  word wVar7;
  ulong uVar8;
  
  uVar3 = n * 0x40 + 0x40;
  uVar8 = shift - uVar3;
  if (uVar3 <= shift) {
    if (n != 0) {
      memset(a,0,n << 3);
    }
    if (0x3f < uVar8) {
      return 0;
    }
    return carry << ((byte)uVar8 & 0x3f);
  }
  uVar3 = shift >> 6;
  bVar2 = (byte)shift;
  bVar4 = bVar2 & 0x3f;
  if (shift < 0x40) {
    uVar8 = 0;
  }
  else {
    uVar8 = a[n - uVar3] << bVar4;
  }
  if ((shift & 0x3f) == 0) {
    uVar5 = n - 1;
    uVar6 = uVar5;
    if (uVar3 < n) {
      do {
        a[uVar6] = a[uVar6 - uVar3];
        uVar5 = uVar6 - 1;
        bVar1 = uVar3 < uVar6;
        uVar6 = uVar5;
      } while (bVar1);
    }
  }
  else {
    wVar7 = carry;
    if (uVar3 < n) {
      wVar7 = a[~uVar3 + n];
    }
    uVar8 = wVar7 >> (-bVar4 & 0x3f) | uVar8;
    uVar5 = n - 1;
    if (uVar3 < uVar5 && n != 0) {
      do {
        n = uVar5;
        a[n] = a[n - uVar3] << (bVar2 & 0x3f) | a[(n - 1) - uVar3] >> 0x40 - (bVar2 & 0x3f);
        uVar5 = n - 1;
      } while (uVar3 < uVar5);
    }
    else if (n == 0) {
      return uVar8;
    }
    if (n <= uVar3) goto LAB_001524eb;
    a[uVar5] = a[uVar5 - uVar3] << (bVar2 & 0x3f) | carry >> 0x40 - (bVar2 & 0x3f);
    uVar5 = n - 2;
  }
  if (uVar5 == 0xffffffffffffffff) {
    return uVar8;
  }
LAB_001524eb:
  a[uVar5] = carry << bVar4;
  if (uVar5 != 0) {
    memset(a,0,uVar5 << 3);
  }
  return uVar8;
}

Assistant:

word wwShHiCarry(word a[], size_t n, size_t shift, word carry)
{
	register word ret = 0;
	ASSERT(wwIsValid(a, n));
	if (shift < B_PER_W * (n + 1))
	{
		size_t wshift = shift / B_PER_W;
		size_t pos;
		shift %= B_PER_W;
		// сохраняем вытесняемые разряды
		if (wshift)
			ret = a[n - wshift] << shift;
		// величина сдвига не кратна длине слова?
		if (shift)
		{
			// дополнительные вытесняемые разряды
			if (wshift < n)
				ret |= a[n - wshift - 1] >> (B_PER_W - shift);
			else
				ret |= carry >> (B_PER_W - shift);
			// сдвиг всех слов, кроме первого
			for (pos = n - 1; pos != SIZE_MAX && pos > wshift; pos--)
				a[pos] = a[pos - wshift] << shift | 
					a[pos - wshift - 1] >> (B_PER_W - shift);
			// второе слово
			if (pos != SIZE_MAX && pos + 1 > wshift)
			{
				a[pos] = a[pos - wshift] << shift | carry >> (B_PER_W - shift);
				--pos;
			}
		}
		// величина сдвига кратна длине слова
		else
		{
			for (pos = n - 1; pos != SIZE_MAX && pos + 1 > wshift; pos--)
				a[pos] = a[pos - wshift];
		}
		// первые слова
		if (pos != SIZE_MAX)
			a[pos--] = carry << shift;
		for (; pos != SIZE_MAX; a[pos--] = 0);
	}
	else
	{
		wwSetZero(a, n);
		shift -= B_PER_W * (n + 1);
		if (shift < B_PER_W)
			ret = carry << shift;

	}
	return ret;
}